

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_demo.cpp
# Opt level: O3

void __thiscall despot::RegDemo::Init(RegDemo *this,istream *is)

{
  pointer pdVar1;
  pointer pvVar2;
  long lVar3;
  vector<despot::State,_std::allocator<despot::State>_> *this_00;
  int iVar4;
  int iVar5;
  istream *piVar6;
  State *pSVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  string tok;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  *local_80;
  int *local_78;
  vector<double,_std::allocator<double>_> *local_70;
  int local_68;
  int local_64;
  RegDemo *local_60;
  ulong local_58;
  State local_50 [32];
  
  local_a0 = &local_90;
  local_98 = 0;
  local_90 = 0;
  piVar6 = std::operator>>(is,(string *)&local_a0);
  piVar6 = std::operator>>(piVar6,(string *)&local_a0);
  local_78 = &this->size_;
  std::istream::operator>>((istream *)piVar6,local_78);
  std::vector<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>::resize
            (&this->states_,(long)this->size_ + 1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->obs_,(long)this->size_ + 1);
  local_70 = &this->trap_prob_;
  std::vector<double,_std::allocator<double>_>::resize(local_70,(long)this->size_ + 1);
  uVar10 = *local_78;
  if (0 < (int)uVar10) {
    uVar12 = 0;
    do {
      pSVar7 = (State *)operator_new(0x20);
      despot::State::State(pSVar7);
      *(undefined ***)pSVar7 = &PTR__State_0010daa8;
      *(int *)(pSVar7 + 0xc) = (int)uVar12;
      (this->states_).
      super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar12] = (RegDemoState *)pSVar7;
      (this->obs_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar12] = (ulong)(uVar12 == 2);
      std::istream::_M_extract<double>((double *)is);
      uVar10 = *local_78;
      if (uVar12 == uVar10 - 1) {
        pdVar1 = (this->trap_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        this->goal_reward_ = pdVar1[uVar12];
        pdVar1[uVar12] = 0.0;
      }
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)(int)uVar10);
  }
  pSVar7 = (State *)operator_new(0x20);
  despot::State::State(pSVar7);
  *(undefined ***)pSVar7 = &PTR__State_0010daa8;
  *(uint *)(pSVar7 + 0xc) = uVar10;
  iVar4 = this->size_;
  (this->states_).
  super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>._M_impl.
  super__Vector_impl_data._M_start[iVar4] = (RegDemoState *)pSVar7;
  (this->obs_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[iVar4] = 2;
  (this->trap_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[iVar4] = 1.0;
  local_80 = &this->transition_probabilities_;
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::resize(local_80,(long)(this->states_).
                          super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->states_).
                          super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3);
  if ((this->states_).
      super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->states_).
      super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar12 = 0;
    local_60 = this;
    do {
      pvVar2 = (this->transition_probabilities_).
               super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar4 = (**(code **)(*(long *)this + 0x28))(this);
      std::
      vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
      ::resize(pvVar2 + uVar12,(long)iVar4);
      local_58 = uVar12 + 1;
      iVar4 = (int)uVar12;
      local_68 = iVar4 + 1;
      local_64 = iVar4 + -1;
      lVar9 = 0;
      this = local_60;
      for (lVar11 = 0; iVar5 = (**(code **)(*(long *)this + 0x28))(this), lVar11 < iVar5;
          lVar11 = lVar11 + 1) {
        uVar10 = *local_78;
        if (uVar12 == uVar10) {
          lVar3 = *(long *)&(local_80->
                            super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar12].
                            super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          despot::State::State(local_50,iVar4,1.0);
          std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                    ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar3 + lVar9),
                     local_50);
LAB_00106db8:
          despot::State::~State(local_50);
        }
        else {
          iVar5 = local_68;
          if (((int)lVar11 == 2) || (iVar5 = iVar4, (int)lVar11 != 0)) {
            if (lVar11 == 1) {
              iVar5 = local_64;
            }
            if (iVar5 < 1) {
              iVar5 = 0;
            }
            iVar8 = uVar10 - 1;
            if (iVar5 < (int)uVar10) {
              iVar8 = iVar5;
            }
            dVar13 = (local_70->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[iVar8];
            if (dVar13 < 1.0) {
              lVar3 = *(long *)&(local_80->
                                super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar12].
                                super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                                ._M_impl.super__Vector_impl_data;
              despot::State::State(local_50,iVar8,1.0 - dVar13);
              std::vector<despot::State,_std::allocator<despot::State>_>::
              emplace_back<despot::State>
                        ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar3 + lVar9),
                         local_50);
              despot::State::~State(local_50);
              dVar13 = (local_70->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[iVar8];
            }
            this = local_60;
            if (0.0 < dVar13) {
              lVar3 = *(long *)&(local_80->
                                super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar12].
                                super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                                ._M_impl.super__Vector_impl_data;
              despot::State::State(local_50,*local_78,dVar13);
              std::vector<despot::State,_std::allocator<despot::State>_>::
              emplace_back<despot::State>
                        ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar3 + lVar9),
                         local_50);
              goto LAB_00106db8;
            }
          }
          else if (uVar12 != uVar10 - 1) {
            this_00 = (local_80->
                      super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar12].
                      super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            despot::State::State(local_50,iVar4,1.0);
            std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                      (this_00,local_50);
            goto LAB_00106db8;
          }
        }
        lVar9 = lVar9 + 0x18;
      }
      uVar12 = local_58;
    } while (local_58 <
             (ulong)((long)(this->states_).
                           super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->states_).
                           super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  return;
}

Assistant:

void RegDemo::Init(istream& is) {
	string tok;
	is >> tok >> tok >> size_;
	states_.resize(size_ + 1);
	obs_.resize(size_ + 1);
	trap_prob_.resize(size_ + 1);
	for (int x = 0; x < size_; x++) {
		states_[x] = new RegDemoState(x);
		obs_[x] = (x == 2 ? 1 : 0);

		is >> trap_prob_[x];

		if (x == size_ - 1) {
			goal_reward_ = trap_prob_[x];
			trap_prob_[x] = 0;
		}
	}
	states_[size_] = new RegDemoState(size_); // Trapped
	obs_[size_] = 2;
	trap_prob_[size_] = 1.0; // No way to escape

	// Build transition matrix
	transition_probabilities_.resize(states_.size());
	for (int s = 0; s < states_.size(); s++) {
		transition_probabilities_[s].resize(NumActions());

		for (int a = 0; a < NumActions(); a++) {
			if (s == size_) {
				transition_probabilities_[s][a].push_back(State(s, 1.0));
			} else if (a == A_STAY) {
				if (s != size_ - 1) // Not a terminal state
					transition_probabilities_[s][a].push_back(State(s, 1.0));
			} else {
				int next = s;
				if (a == A_RIGHT)
					next = s + 1;
				if (a == A_LEFT)
					next = s - 1;

				if (next < 0)
					next = 0;
				if (next >= size_)
					next = size_ - 1;

				if (trap_prob_[next] < 1.0)
					transition_probabilities_[s][a].push_back(
						State(next, 1 - trap_prob_[next]));
				if (trap_prob_[next] > 0.0)
					transition_probabilities_[s][a].push_back(
						State(size_, trap_prob_[next]));
			}
		}
	}
}